

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O3

shared_ptr<Component> *
std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
__copy_move_b<std::shared_ptr<Component>*,std::shared_ptr<Component>*>
          (shared_ptr<Component> *__first,shared_ptr<Component> *__last,
          shared_ptr<Component> *__result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<Component> *psVar3;
  long lVar4;
  
  lVar4 = (long)__last - (long)__first >> 4;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    psVar3 = __last + -1;
    do {
      peVar1 = (psVar3->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var2 = (psVar3->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
      ;
      (psVar3->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (psVar3->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = __result[-1].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
      __result[-1].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      __result[-1].super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var2;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        _Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      __result = __result + -1;
      lVar4 = lVar4 + -1;
      psVar3 = psVar3 + -1;
    } while (1 < lVar4);
  }
  return __result;
}

Assistant:

void *utf8valid(const void *str) {
  const char *s = (const char *)str;

  while ('\0' != *s) {
    if (0xf0 == (0xf8 & *s)) {
      // ensure each of the 3 following bytes in this 4-byte
      // utf8 codepoint began with 0b10xxxxxx
      if ((0x80 != (0xc0 & s[1])) || (0x80 != (0xc0 & s[2])) ||
          (0x80 != (0xc0 & s[3]))) {
        return (void *)s;
      }

      // ensure that our utf8 codepoint ended after 4 bytes
      if (0x80 == (0xc0 & s[4])) {
        return (void *)s;
      }

      // ensure that the top 5 bits of this 4-byte utf8
      // codepoint were not 0, as then we could have used
      // one of the smaller encodings
      if ((0 == (0x07 & s[0])) && (0 == (0x30 & s[1]))) {
        return (void *)s;
      }

      // 4-byte utf8 code point (began with 0b11110xxx)
      s += 4;
    } else if (0xe0 == (0xf0 & *s)) {
      // ensure each of the 2 following bytes in this 3-byte
      // utf8 codepoint began with 0b10xxxxxx
      if ((0x80 != (0xc0 & s[1])) || (0x80 != (0xc0 & s[2]))) {
        return (void *)s;
      }

      // ensure that our utf8 codepoint ended after 3 bytes
      if (0x80 == (0xc0 & s[3])) {
        return (void *)s;
      }

      // ensure that the top 5 bits of this 3-byte utf8
      // codepoint were not 0, as then we could have used
      // one of the smaller encodings
      if ((0 == (0x0f & s[0])) && (0 == (0x20 & s[1]))) {
        return (void *)s;
      }

      // 3-byte utf8 code point (began with 0b1110xxxx)
      s += 3;
    } else if (0xc0 == (0xe0 & *s)) {
      // ensure the 1 following byte in this 2-byte
      // utf8 codepoint began with 0b10xxxxxx
      if (0x80 != (0xc0 & s[1])) {
        return (void *)s;
      }

      // ensure that our utf8 codepoint ended after 2 bytes
      if (0x80 == (0xc0 & s[2])) {
        return (void *)s;
      }

      // ensure that the top 4 bits of this 2-byte utf8
      // codepoint were not 0, as then we could have used
      // one of the smaller encodings
      if (0 == (0x1e & s[0])) {
        return (void *)s;
      }

      // 2-byte utf8 code point (began with 0b110xxxxx)
      s += 2;
    } else if (0x00 == (0x80 & *s)) {
      // 1-byte ascii (began with 0b0xxxxxxx)
      s += 1;
    } else {
      // we have an invalid 0b1xxxxxxx utf8 code point entry
      return (void *)s;
    }
  }

  return 0;
}